

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

type __thiscall
nonstd::optional_lite::
optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>::
operator=(optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
          *this,optional<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                *other)

{
  void *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      pvVar1 = *(void **)&this->contained;
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,*(long *)((long)&this->contained + 0x10) - (long)pvVar1);
      }
      this->has_value_ = false;
    }
    else {
      std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
      _M_move_assign((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      *)&this->contained,&other->contained);
    }
  }
  else if (other->has_value_ != false) {
    optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>::
    initialize<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
              ((optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                *)this,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)&other->contained);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }